

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

Expr * __thiscall nivalis::ParseSession::parse(Expr *__return_storage_ptr__,ParseSession *this)

{
  pointer pAVar1;
  bool bVar2;
  value_type_conflict3 local_20;
  
  local_20 = -1;
  std::vector<long,_std::allocator<long>_>::resize
            (&this->tok_link,this->expr->_M_string_length,&local_20);
  pAVar1 = (this->result).ast.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->result).ast.
      super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>._M_impl.
      super__Vector_impl_data._M_finish != pAVar1) {
    (this->result).ast.
    super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>._M_impl.
    super__Vector_impl_data._M_finish = pAVar1;
  }
  bVar2 = _mk_tok_link(this);
  if (bVar2) {
    bVar2 = _parse(this,0,this->expr->_M_string_length,0);
    if (bVar2) goto LAB_0010b087;
  }
  pAVar1 = (this->result).ast.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->result).ast.
      super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>._M_impl.
      super__Vector_impl_data._M_finish != pAVar1) {
    (this->result).ast.
    super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>._M_impl.
    super__Vector_impl_data._M_finish = pAVar1;
  }
  std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::resize
            (&(this->result).ast,1);
LAB_0010b087:
  std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::vector
            (&__return_storage_ptr__->ast,&(this->result).ast);
  return __return_storage_ptr__;
}

Assistant:

Expr parse() {
        tok_link.resize(expr.size(), -1);
        result.ast.clear();
        if (!_mk_tok_link() ||
            !_parse(0, static_cast<int64_t>(expr.size()), _PRI_LOWEST)) {
            result.ast.clear();
            result.ast.resize(1);
        }
        return result;
    }